

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_blas2.c
# Opt level: O1

int sp_cgemv(char *trans,singlecomplex alpha,SuperMatrix *A,singlecomplex *x,int incx,
            singlecomplex beta,singlecomplex *y,int incy)

{
  float fVar1;
  float fVar2;
  byte bVar3;
  long lVar4;
  uint uVar5;
  int_t *piVar6;
  ulong uVar7;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  float *pfVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  void *pvVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar20;
  float fVar21;
  int info;
  char msg [256];
  int local_17c;
  int local_178;
  int local_174;
  int local_170;
  uint local_16c;
  ulong local_168;
  void *local_160;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [16];
  char local_138 [264];
  
  fVar20 = beta.r;
  fVar21 = beta.i;
  fVar18 = alpha.r;
  fVar19 = alpha.i;
  bVar3 = *trans;
  pvVar16 = A->Store;
  lVar4 = *(long *)((long)pvVar16 + 8);
  local_17c = 0;
  if ((bVar3 - 0x43 < 0x2c) && ((0x80000020801U >> ((ulong)(bVar3 - 0x43) & 0x3f) & 1) != 0)) {
    if ((A->nrow < 0) || (A->ncol < 0)) {
      local_17c = 3;
    }
    else if (incx == 0) {
      local_17c = 5;
    }
    else if (incy == 0) {
      local_17c = 8;
    }
  }
  else {
    local_17c = 1;
  }
  if (local_17c == 0) {
    if (((A->nrow != 0) && (uVar15 = (ulong)(uint)A->ncol, uVar15 != 0)) &&
       ((local_16c = -(uint)(fVar18 == 0.0 && fVar19 == 0.0), (local_16c & 1) == 0 ||
        ((((fVar20 != 1.0 || (NAN(fVar20))) || (fVar21 != 0.0)) || (NAN(fVar21))))))) {
      piVar6 = &A->ncol;
      if ((bVar3 & 0xdf) == 0x4e) {
        piVar6 = &A->nrow;
      }
      uVar5 = *piVar6;
      uVar7 = (ulong)uVar5;
      if (incx < 1) {
        piVar6 = &A->nrow;
        if ((bVar3 & 0xdf) == 0x4e) {
          piVar6 = &A->ncol;
        }
        lVar17 = (long)incx * (1 - (long)*piVar6);
      }
      else {
        lVar17 = 0;
      }
      iVar12 = (1 - uVar5) * incy;
      if (0 < incy) {
        iVar12 = 0;
      }
      if (((fVar20 != 1.0) || (NAN(fVar20))) || ((fVar21 != 0.0 || (NAN(fVar21))))) {
        if (incy == 1) {
          if (fVar20 != 0.0 || fVar21 != 0.0) {
            if (0 < (int)uVar5) {
              uVar10 = 0;
              do {
                fVar1 = y[uVar10].r;
                y[uVar10].r = fVar20 * fVar1 + y[uVar10].i * -fVar21;
                y[uVar10].i = fVar1 * fVar21 + y[uVar10].i * fVar20;
                uVar10 = uVar10 + 1;
              } while (uVar7 != uVar10);
            }
          }
          else if (0 < (int)uVar5) {
            local_148._8_4_ = in_XMM0_Dc;
            local_148._0_8_ = alpha;
            local_148._12_4_ = in_XMM0_Dd;
            local_178 = iVar12;
            local_174 = incx;
            local_170 = incy;
            local_168 = uVar15;
            local_160 = pvVar16;
            local_158 = fVar19;
            fStack_154 = fVar19;
            fStack_150 = fVar19;
            fStack_14c = fVar19;
            memset(y,0,uVar7 * 8);
            uVar15 = local_168;
            pvVar16 = local_160;
            fVar18 = (float)local_148._0_4_;
            fVar19 = local_158;
            incx = local_174;
            iVar12 = local_178;
            incy = local_170;
          }
        }
        else if (fVar20 != 0.0 || fVar21 != 0.0) {
          if (0 < (int)uVar5) {
            pfVar11 = &y[iVar12].i;
            do {
              fVar1 = ((singlecomplex *)(pfVar11 + -1))->r;
              fVar2 = *pfVar11;
              ((singlecomplex *)(pfVar11 + -1))->r = fVar20 * fVar1 + fVar2 * -fVar21;
              *pfVar11 = fVar1 * fVar21 + fVar2 * fVar20;
              pfVar11 = pfVar11 + (long)incy * 2;
              uVar5 = (int)uVar7 - 1;
              uVar7 = (ulong)uVar5;
            } while (uVar5 != 0);
          }
        }
        else if (0 < (int)uVar5) {
          pfVar11 = &y[iVar12].i;
          do {
            ((singlecomplex *)(pfVar11 + -1))->r = 0.0;
            ((singlecomplex *)(pfVar11 + -1))->i = 0.0;
            pfVar11 = pfVar11 + (long)incy * 2;
            uVar5 = (int)uVar7 - 1;
            uVar7 = (ulong)uVar5;
          } while (uVar5 != 0);
        }
      }
      if ((local_16c & 1) == 0) {
        iVar14 = (int)uVar15;
        if ((bVar3 | 0x20) == 0x6e) {
          if (incy == 1) {
            if (iVar14 < 1) {
              return 0;
            }
            uVar7 = 0;
            do {
              fVar20 = x[lVar17].r;
              if (((fVar20 != 0.0) || (NAN(fVar20))) || ((x[lVar17].i != 0.0 || (NAN(x[lVar17].i))))
                 ) {
                iVar12 = *(int *)(*(long *)((long)pvVar16 + 0x18) + uVar7 * 4);
                lVar9 = (long)iVar12;
                iVar14 = *(int *)(*(long *)((long)pvVar16 + 0x18) + 4 + uVar7 * 4);
                if (iVar12 < iVar14) {
                  fVar21 = fVar18 * fVar20 + x[lVar17].i * -fVar19;
                  fVar20 = fVar20 * fVar19 + x[lVar17].i * fVar18;
                  lVar13 = *(long *)((long)pvVar16 + 0x10);
                  do {
                    iVar12 = *(int *)(lVar13 + lVar9 * 4);
                    fVar1 = *(float *)(lVar4 + lVar9 * 8);
                    fVar2 = *(float *)(lVar4 + 4 + lVar9 * 8);
                    y[iVar12].r = fVar21 * fVar1 + fVar2 * -fVar20 + y[iVar12].r;
                    y[iVar12].i = fVar1 * fVar20 + fVar2 * fVar21 + y[iVar12].i;
                    lVar9 = lVar9 + 1;
                  } while (iVar14 != lVar9);
                }
              }
              lVar17 = lVar17 + incx;
              uVar7 = uVar7 + 1;
            } while (uVar7 != uVar15);
            return 0;
          }
          uVar8 = 0x22b;
        }
        else if ((byte)(*trans | 0x20U) == 0x74) {
          if (incx == 1) {
            if (iVar14 < 1) {
              return 0;
            }
            lVar17 = *(long *)((long)pvVar16 + 0x18);
            lVar9 = (long)iVar12;
            uVar7 = 0;
            do {
              iVar12 = *(int *)(lVar17 + uVar7 * 4);
              lVar13 = (long)iVar12;
              iVar14 = *(int *)(lVar17 + 4 + uVar7 * 4);
              fVar20 = 0.0;
              fVar21 = 0.0;
              if (iVar12 < iVar14) {
                do {
                  iVar12 = *(int *)(*(long *)((long)pvVar16 + 0x10) + lVar13 * 4);
                  fVar1 = *(float *)(lVar4 + lVar13 * 8);
                  fVar2 = *(float *)(lVar4 + 4 + lVar13 * 8);
                  fVar20 = fVar20 + (fVar1 * x[iVar12].r - x[iVar12].i * fVar2);
                  fVar21 = fVar21 + fVar2 * x[iVar12].r + fVar1 * x[iVar12].i;
                  lVar13 = lVar13 + 1;
                } while (iVar14 != lVar13);
              }
              y[lVar9].r = fVar18 * fVar20 + fVar21 * -fVar19 + y[lVar9].r;
              uVar7 = uVar7 + 1;
              y[lVar9].i = fVar20 * fVar19 + fVar18 * fVar21 + y[lVar9].i;
              lVar9 = lVar9 + incy;
            } while (uVar7 != uVar15);
            return 0;
          }
          uVar8 = 0x23d;
        }
        else {
          if (incx == 1) {
            if (iVar14 < 1) {
              return 0;
            }
            lVar17 = *(long *)((long)pvVar16 + 0x18);
            lVar9 = (long)iVar12;
            uVar7 = 0;
            do {
              iVar12 = *(int *)(lVar17 + uVar7 * 4);
              lVar13 = (long)iVar12;
              iVar14 = *(int *)(lVar17 + 4 + uVar7 * 4);
              fVar20 = 0.0;
              fVar21 = 0.0;
              if (iVar12 < iVar14) {
                do {
                  iVar12 = *(int *)(*(long *)((long)pvVar16 + 0x10) + lVar13 * 4);
                  fVar1 = *(float *)(lVar4 + lVar13 * 8);
                  fVar2 = *(float *)(lVar4 + 4 + lVar13 * 8);
                  fVar20 = fVar20 + fVar1 * x[iVar12].r + fVar2 * x[iVar12].i;
                  fVar21 = fVar21 + (fVar1 * x[iVar12].i - fVar2 * x[iVar12].r);
                  lVar13 = lVar13 + 1;
                } while (iVar14 != lVar13);
              }
              y[lVar9].r = fVar18 * fVar20 + fVar21 * -fVar19 + y[lVar9].r;
              uVar7 = uVar7 + 1;
              y[lVar9].i = fVar20 * fVar19 + fVar18 * fVar21 + y[lVar9].i;
              lVar9 = lVar9 + incy;
            } while (uVar7 != uVar15);
            return 0;
          }
          uVar8 = 0x252;
        }
        sprintf(local_138,"%s at line %d in file %s\n","Not implemented.",uVar8,
                "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/csp_blas2.c"
               );
        superlu_abort_and_exit(local_138);
      }
    }
  }
  else {
    input_error("sp_cgemv ",&local_17c);
  }
  return 0;
}

Assistant:

int
sp_cgemv(char *trans, singlecomplex alpha, SuperMatrix *A, singlecomplex *x, 
	 int incx, singlecomplex beta, singlecomplex *y, int incy)
{

    /* Local variables */
    NCformat *Astore;
    singlecomplex   *Aval;
    int info;
    singlecomplex temp, temp1;
    int lenx, leny, i, j, irow;
    int iy, jx, jy, kx, ky;
    int notran;
    singlecomplex comp_zero = {0.0, 0.0};
    singlecomplex comp_one = {1.0, 0.0};

    notran = ( strncmp(trans, "N", 1)==0 || strncmp(trans, "n", 1)==0 );
    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Test the input parameters */
    info = 0;
    if ( !notran && strncmp(trans, "T", 1)!=0 && strncmp(trans, "C", 1)!=0)
        info = 1;
    else if ( A->nrow < 0 || A->ncol < 0 ) info = 3;
    else if (incx == 0) info = 5;
    else if (incy == 0)	info = 8;
    if (info != 0) {
	input_error("sp_cgemv ", &info);
	return 0;
    }

    /* Quick return if possible. */
    if ( A->nrow == 0 || A->ncol == 0 || 
	 (c_eq(&alpha, &comp_zero) && c_eq(&beta, &comp_one)) )
	return 0;

    /* Set  LENX  and  LENY, the lengths of the vectors x and y, and set 
       up the start points in  X  and  Y. */
    if ( notran ) {
	lenx = A->ncol;
	leny = A->nrow;
    } else {
	lenx = A->nrow;
	leny = A->ncol;
    }
    if (incx > 0) kx = 0;
    else kx =  - (lenx - 1) * incx;
    if (incy > 0) ky = 0;
    else ky =  - (leny - 1) * incy;

    /* Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A. */
    /* First form  y := beta*y. */
    if ( !c_eq(&beta, &comp_one) ) {
	if (incy == 1) {
	    if ( c_eq(&beta, &comp_zero) )
		for (i = 0; i < leny; ++i) y[i] = comp_zero;
	    else
		for (i = 0; i < leny; ++i) 
		  cc_mult(&y[i], &beta, &y[i]);
	} else {
	    iy = ky;
	    if ( c_eq(&beta, &comp_zero) )
		for (i = 0; i < leny; ++i) {
		    y[iy] = comp_zero;
		    iy += incy;
		}
	    else
		for (i = 0; i < leny; ++i) {
		    cc_mult(&y[iy], &beta, &y[iy]);
		    iy += incy;
		}
	}
    }
    
    if ( c_eq(&alpha, &comp_zero) ) return 0;

    if ( notran ) {
	/* Form  y := alpha*A*x + y. */
	jx = kx;
	if (incy == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		if ( !c_eq(&x[jx], &comp_zero) ) {
		    cc_mult(&temp, &alpha, &x[jx]);
		    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
			irow = Astore->rowind[i];
			cc_mult(&temp1, &temp,  &Aval[i]);
			c_add(&y[irow], &y[irow], &temp1);
		    }
		}
		jx += incx;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    } else if (strncmp(trans, "T", 1) == 0 || strncmp(trans, "t", 1) == 0) {
	/* Form  y := alpha*A'*x + y. */
	jy = ky;
	if (incx == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		temp = comp_zero;
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    irow = Astore->rowind[i];
		    cc_mult(&temp1, &Aval[i], &x[irow]);
		    c_add(&temp, &temp, &temp1);
		}
		cc_mult(&temp1, &alpha, &temp);
		c_add(&y[jy], &y[jy], &temp1);
		jy += incy;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    } else { /* trans == 'C' or 'c' */
	/* Form  y := alpha * conj(A) * x + y. */
	singlecomplex temp2;
	jy = ky;
	if (incx == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		temp = comp_zero;
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    irow = Astore->rowind[i];
		    temp2.r = Aval[i].r;
		    temp2.i = -Aval[i].i;  /* conjugation */
		    cc_mult(&temp1, &temp2, &x[irow]);
		    c_add(&temp, &temp, &temp1);
		}
		cc_mult(&temp1, &alpha, &temp);
		c_add(&y[jy], &y[jy], &temp1);
		jy += incy;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    }

    return 0;    
}